

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epanet3.cpp
# Opt level: O2

int EN_runEpanet(char *inpFile,char *rptFile,char *outFile)

{
  bool *__return_storage_ptr__;
  double dVar1;
  int iVar2;
  clock_t cVar3;
  ostream *poVar4;
  clock_t cVar5;
  int seconds;
  char *pcVar6;
  undefined1 local_1770 [8];
  Project p;
  stringstream ss;
  long local_1d8;
  string local_1d0 [368];
  double local_60;
  undefined1 local_58 [8];
  int t;
  int local_34 [2];
  int tstep;
  
  std::operator<<((ostream *)&std::cout,"\n... EPANET Version 3.0\n");
  Epanet::Project::Project((Project *)local_1770);
  cVar3 = clock();
  iVar2 = Epanet::Project::openReport((Project *)local_1770,rptFile);
  if (iVar2 == 0) {
    std::operator<<((ostream *)&std::cout,"\n    Reading input file ...");
    iVar2 = Epanet::Project::load((Project *)local_1770,inpFile);
    if (iVar2 == 0) {
      iVar2 = Epanet::Project::openOutput((Project *)local_1770,outFile);
      if (iVar2 == 0) {
        Epanet::Project::writeSummary((Project *)local_1770);
        std::operator<<((ostream *)&std::cout,"\n    Initializing solver ...");
        iVar2 = Epanet::Project::initSolver((Project *)local_1770,false);
        if (iVar2 == 0) {
          std::operator<<((ostream *)&std::cout,"\n    ");
          local_58._0_4_ = 0;
          local_34[0] = 0;
          __return_storage_ptr__ = &p.networkEmpty;
          do {
            poVar4 = std::operator<<((ostream *)&std::cout,"\r    Solving network at ");
            Utilities::getTime_abi_cxx11_
                      ((string *)__return_storage_ptr__,
                       (Utilities *)(ulong)(uint)(local_34[0] + local_58._0_4_),seconds);
            poVar4 = std::operator<<(poVar4,(string *)__return_storage_ptr__);
            std::operator<<(poVar4," hrs ...        ");
            std::__cxx11::string::~string((string *)__return_storage_ptr__);
            iVar2 = Epanet::Project::runSolver((Project *)local_1770,(int *)local_58);
            Epanet::Project::writeMsgLog((Project *)local_1770);
            if (iVar2 == 0) {
              iVar2 = Epanet::Project::advanceSolver((Project *)local_1770,local_34);
            }
          } while ((iVar2 == 0) && (0 < local_34[0]));
          if (iVar2 == 0) {
            cVar5 = clock();
            std::__cxx11::stringstream::stringstream((stringstream *)&p.networkEmpty);
            poVar4 = (ostream *)&local_1d8;
            std::operator<<(poVar4,"\n  Simulation completed in ");
            std::__cxx11::stringbuf::str();
            Epanet::Project::writeMsg((Project *)local_1770,(string *)local_58);
            std::__cxx11::string::~string((string *)local_58);
            std::__cxx11::string::string((string *)local_58,"",(allocator *)local_34);
            std::__cxx11::stringbuf::str(local_1d0);
            local_60 = (double)(cVar5 - cVar3) / 1000000.0;
            std::__cxx11::string::~string((string *)local_58);
            dVar1 = local_60;
            if (0.001 <= local_60) {
              *(undefined8 *)(local_1d0 + *(long *)(local_1d8 + -0x18)) = 3;
              poVar4 = std::ostream::_M_insert<double>(dVar1);
              pcVar6 = " sec.";
            }
            else {
              pcVar6 = "< 0.001 sec.";
            }
            std::operator<<(poVar4,pcVar6);
            std::__cxx11::stringbuf::str();
            Epanet::Project::writeMsg((Project *)local_1770,(string *)local_58);
            std::__cxx11::string::~string((string *)local_58);
            std::operator<<((ostream *)&std::cout,
                            "\n    Writing report ...                           ");
            iVar2 = Epanet::Project::writeReport((Project *)local_1770);
            std::operator<<((ostream *)&std::cout,
                            "\n    Simulation completed.                         \n");
            poVar4 = std::operator<<((ostream *)&std::cout,"\n... EPANET completed in ");
            std::__cxx11::stringbuf::str();
            poVar4 = std::operator<<(poVar4,(string *)local_58);
            std::operator<<(poVar4,"\n");
            std::__cxx11::string::~string((string *)local_58);
            std::__cxx11::stringstream::~stringstream((stringstream *)&p.networkEmpty);
            if (iVar2 == 0) {
              iVar2 = 0;
              goto LAB_00123f46;
            }
          }
        }
      }
    }
  }
  Epanet::Project::writeMsgLog((Project *)local_1770);
  std::operator<<((ostream *)&std::cout,"\n\n    There were errors. See report file for details.\n")
  ;
LAB_00123f46:
  Epanet::Project::~Project((Project *)local_1770);
  return iVar2;
}

Assistant:

int EN_runEpanet(const char* inpFile, const char* rptFile, const char* outFile)
{
    std::cout << "\n... EPANET Version 3.0\n";

    // ... declare a Project variable and an error indicator
    Project p;
    int err = 0;

    // ... initialize execution time clock
    clock_t start_t = clock();

    for (;;)
    {
        // ... open the command line files and load network data
        if ( (err = p.openReport(rptFile)) ) break;
        std::cout << "\n    Reading input file ...";
        if ( (err = p.load(inpFile)) ) break;
        if ( (err = p.openOutput(outFile)) ) break;
        p.writeSummary();

        // ... initialize the solver
        std::cout << "\n    Initializing solver ...";
        if ( (err = p.initSolver(false)) ) break;
        std::cout << "\n    ";

        // ... step through each time period
        int t = 0;
        int tstep = 0;
        do
        {
            std::cout << "\r    Solving network at "                     //r
                << Utilities::getTime(t+tstep) << " hrs ...        ";

            // ... run solver to compute hydraulics
            err = p.runSolver(&t);
            p.writeMsgLog();

            // ... advance solver to next period in time while solving for water quality
            if ( !err ) err = p.advanceSolver(&tstep);
        } while (tstep > 0 && !err );
        break;
    }

    // ... simulation was successful
    if ( !err )
    {
        // ... report execution time
        clock_t end_t = clock();
        double cpu_t = ((double) (end_t - start_t)) / CLOCKS_PER_SEC;
        std::stringstream ss;
        ss << "\n  Simulation completed in ";
        p.writeMsg(ss.str());
        ss.str("");
        if ( cpu_t < 0.001 ) ss << "< 0.001 sec.";
        else ss << std::setprecision(3) << cpu_t << " sec.";
        p.writeMsg(ss.str());

        // ... report simulation results
        std::cout << "\n    Writing report ...                           ";
        err = p.writeReport();
        std::cout << "\n    Simulation completed.                         \n";
        std::cout << "\n... EPANET completed in " << ss.str() << "\n";
    }

    if ( err )
    {
        p.writeMsgLog();
        std::cout << "\n\n    There were errors. See report file for details.\n";
        return err;
    }
    return 0;
}